

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

universal_hash_function_t *
new_universal_hash_function
          (universal_hash_function_t *__return_storage_ptr__,size_t *seed,uint buckets)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  
  lVar2 = *seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar5._0_8_ = lVar2;
  auVar5._12_4_ = 0x45300000;
  dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 5.421010862427522e-20 *
          1.8446744073709552e+19;
  uVar4 = (ulong)dVar6;
  __return_storage_ptr__->mult = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4
  ;
  sVar3 = lVar2 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  *seed = sVar3;
  auVar7._8_4_ = (int)(sVar3 >> 0x20);
  auVar7._0_8_ = sVar3;
  auVar7._12_4_ = 0x45300000;
  dVar6 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) * 5.421010862427522e-20 *
          1.8446744073709552e+19;
  uVar4 = (ulong)dVar6;
  __return_storage_ptr__->add = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
  iVar1 = uint32_log2(buckets);
  __return_storage_ptr__->log2_buckets = iVar1;
  return __return_storage_ptr__;
}

Assistant:

universal_hash_function_t new_universal_hash_function( size_t * seed,
       unsigned buckets )
{
    universal_hash_function_t result;
    result.mult = (size_t) (SIZE_MAX * rand_next( seed ));
    result.add  = (size_t) (SIZE_MAX * rand_next( seed ));
    result.log2_buckets = int_log2( buckets );
    return result;
}